

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_points_tree_decoder.cc
# Opt level: O1

bool __thiscall
draco::FloatPointsTreeDecoder::DecodePointCloudKdTreeInternal
          (FloatPointsTreeDecoder *this,DecoderBuffer *buffer,
          vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
          *qpoints)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  oit;
  DynamicIntegerPointsKdTreeDecoder<0> qpoints_decoder;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  local_430;
  DynamicIntegerPointsKdTreeDecoder<4> local_428;
  
  if (buffer->data_size_ < buffer->pos_ + 4) {
    return false;
  }
  (this->qinfo_).quantization_bits = *(uint32_t *)(buffer->data_ + buffer->pos_);
  buffer->pos_ = buffer->pos_ + 4;
  if (0x1f < (this->qinfo_).quantization_bits) {
    return false;
  }
  if (buffer->pos_ + 4 <= buffer->data_size_) {
    (this->qinfo_).range = *(float *)(buffer->data_ + buffer->pos_);
    lVar4 = buffer->pos_;
    lVar1 = lVar4 + 4;
    buffer->pos_ = lVar1;
    if (lVar4 + 8 <= buffer->data_size_) {
      this->num_points_ = *(uint32_t *)(buffer->data_ + lVar1);
      buffer->pos_ = buffer->pos_ + 4;
      uVar2 = this->num_points_;
      if ((uVar2 == this->num_points_from_header_ || this->num_points_from_header_ == 0) &&
         (buffer->pos_ + 4 <= buffer->data_size_)) {
        uVar3 = *(uint *)(buffer->data_ + buffer->pos_);
        this->compression_level_ = uVar3;
        buffer->pos_ = buffer->pos_ + 4;
        if (6 < uVar3) {
          printf("FloatPointsTreeDecoder: compression level %i not supported.\n");
          return false;
        }
        if ((ulong)uVar2 != 0) {
          local_430.oit_.container =
               (back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
                )(back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
                  )qpoints;
          std::
          vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
          ::reserve(qpoints,(ulong)uVar2);
          switch(this->compression_level_) {
          case 0:
            DynamicIntegerPointsKdTreeDecoder<0>::DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<0> *)&local_428,3);
            DynamicIntegerPointsKdTreeDecoder<0>::
            DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                      ((DynamicIntegerPointsKdTreeDecoder<0> *)&local_428,buffer,&local_430,
                       0xffffffff);
            DynamicIntegerPointsKdTreeDecoder<0>::~DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<0> *)&local_428);
            break;
          case 1:
            DynamicIntegerPointsKdTreeDecoder<1>::DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<1> *)&local_428,3);
            DynamicIntegerPointsKdTreeDecoder<1>::
            DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                      ((DynamicIntegerPointsKdTreeDecoder<1> *)&local_428,buffer,&local_430,
                       0xffffffff);
            DynamicIntegerPointsKdTreeDecoder<1>::~DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<1> *)&local_428);
            break;
          case 2:
            DynamicIntegerPointsKdTreeDecoder<2>::DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<2> *)&local_428,3);
            DynamicIntegerPointsKdTreeDecoder<2>::
            DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                      ((DynamicIntegerPointsKdTreeDecoder<2> *)&local_428,buffer,&local_430,
                       0xffffffff);
            DynamicIntegerPointsKdTreeDecoder<2>::~DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<2> *)&local_428);
            break;
          case 3:
            DynamicIntegerPointsKdTreeDecoder<3>::DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<3> *)&local_428,3);
            DynamicIntegerPointsKdTreeDecoder<3>::
            DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                      ((DynamicIntegerPointsKdTreeDecoder<3> *)&local_428,buffer,&local_430,
                       0xffffffff);
            DynamicIntegerPointsKdTreeDecoder<3>::~DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<3> *)&local_428);
            break;
          case 4:
            DynamicIntegerPointsKdTreeDecoder<4>::DynamicIntegerPointsKdTreeDecoder(&local_428,3);
            DynamicIntegerPointsKdTreeDecoder<4>::
            DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                      (&local_428,buffer,&local_430,0xffffffff);
            DynamicIntegerPointsKdTreeDecoder<4>::~DynamicIntegerPointsKdTreeDecoder(&local_428);
            break;
          case 5:
            DynamicIntegerPointsKdTreeDecoder<5>::DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<5> *)&local_428,3);
            DynamicIntegerPointsKdTreeDecoder<5>::
            DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                      ((DynamicIntegerPointsKdTreeDecoder<5> *)&local_428,buffer,&local_430,
                       0xffffffff);
            DynamicIntegerPointsKdTreeDecoder<5>::~DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<5> *)&local_428);
            break;
          case 6:
            DynamicIntegerPointsKdTreeDecoder<6>::DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<6> *)&local_428,3);
            DynamicIntegerPointsKdTreeDecoder<6>::
            DecodePoints<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
                      ((DynamicIntegerPointsKdTreeDecoder<6> *)&local_428,buffer,&local_430,
                       0xffffffff);
            DynamicIntegerPointsKdTreeDecoder<6>::~DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<6> *)&local_428);
            break;
          default:
            goto LAB_0015c955;
          }
        }
        return ((long)(qpoints->
                      super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(qpoints->
                      super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 -
               (ulong)this->num_points_ == 0;
      }
    }
  }
LAB_0015c955:
  return false;
}

Assistant:

bool FloatPointsTreeDecoder::DecodePointCloudKdTreeInternal(
    DecoderBuffer *buffer, std::vector<Point3ui> *qpoints) {
  if (!buffer->Decode(&qinfo_.quantization_bits)) {
    return false;
  }
  if (qinfo_.quantization_bits > 31) {
    return false;
  }
  if (!buffer->Decode(&qinfo_.range)) {
    return false;
  }
  if (!buffer->Decode(&num_points_)) {
    return false;
  }
  if (num_points_from_header_ > 0 && num_points_ != num_points_from_header_) {
    return false;
  }
  if (!buffer->Decode(&compression_level_)) {
    return false;
  }

  // Only allow compression level in [0..6].
  if (6 < compression_level_) {
    DRACO_LOGE("FloatPointsTreeDecoder: compression level %i not supported.\n",
               compression_level_);
    return false;
  }

  std::back_insert_iterator<std::vector<Point3ui>> oit_qpoints =
      std::back_inserter(*qpoints);
  ConversionOutputIterator<std::back_insert_iterator<std::vector<Point3ui>>,
                           Converter>
      oit(oit_qpoints);
  if (num_points_ > 0) {
    qpoints->reserve(num_points_);
    switch (compression_level_) {
      case 0: {
        DynamicIntegerPointsKdTreeDecoder<0> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      case 1: {
        DynamicIntegerPointsKdTreeDecoder<1> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      case 2: {
        DynamicIntegerPointsKdTreeDecoder<2> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      case 3: {
        DynamicIntegerPointsKdTreeDecoder<3> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      case 4: {
        DynamicIntegerPointsKdTreeDecoder<4> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      case 5: {
        DynamicIntegerPointsKdTreeDecoder<5> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      case 6: {
        DynamicIntegerPointsKdTreeDecoder<6> qpoints_decoder(3);
        qpoints_decoder.DecodePoints(buffer, oit);
        break;
      }
      default:
        return false;
    }
  }

  if (qpoints->size() != num_points_) {
    return false;
  }
  return true;
}